

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d8_h2_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  uint in_R8D;
  undefined1 auVar3 [16];
  byte in_stack_00000008;
  __m256i ff;
  __m256i max;
  __m256i res1;
  __m256i res0;
  __m256i signal [2];
  ptrdiff_t in_stack_fffffffffffffe90;
  __m256i *in_stack_fffffffffffffe98;
  __m256i *in_stack_fffffffffffffec0;
  int16_t *in_stack_fffffffffffffec8;
  __m256i *in_stack_fffffffffffffed0;
  __m256i *in_stack_fffffffffffffed8;
  __m256i *in_stack_fffffffffffffee0;
  __m256i *in_stack_fffffffffffffee8;
  __m256i *in_stack_fffffffffffffef0;
  uint16_t *in_stack_fffffffffffffef8;
  undefined4 local_ac;
  undefined8 uStack_70;
  
  uVar2 = (short)(1 << (in_stack_00000008 & 0x1f)) - 1;
  auVar1 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar2,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar2,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar2,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar2,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar2,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar2,7);
  auVar3 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar2,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar2,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar2,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar2,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar2,6);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar2,7);
  auVar3 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  uStack_70 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,0);
  pack_2t_filter(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  local_ac = in_R8D;
  do {
    pack_8x2_2t_pixels((uint16_t *)uStack_70,auVar3._8_8_,auVar3._0_8_);
    filter_16_2t_pixels(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    store_8x2_pixels(uStack_70,auVar3._8_8_,auVar3._0_8_,(uint16_t *)in_stack_fffffffffffffe98,
                     in_stack_fffffffffffffe90);
    local_ac = local_ac - 2;
  } while (1 < local_ac);
  if (local_ac != 0) {
    pack_8x1_2t_pixels(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    filter_8x1_2t_pixels(auVar3._8_8_,auVar3._0_8_,in_stack_fffffffffffffe98);
    store_8x1_pixels(uStack_70,auVar3._8_8_,auVar3._0_8_);
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_h2_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m256i signal[2], res0, res1;
  const __m256i max = _mm256_set1_epi16((1 << bd) - 1);

  __m256i ff;
  pack_2t_filter(filter, &ff);

  src_ptr -= 3;
  do {
    pack_8x2_2t_pixels(src_ptr, src_pitch, signal);
    filter_16_2t_pixels(signal, &ff, &res0, &res1);
    store_8x2_pixels(&res0, &res1, &max, dst_ptr, dst_pitch);
    height -= 2;
    src_ptr += src_pitch << 1;
    dst_ptr += dst_pitch << 1;
  } while (height > 1);

  if (height > 0) {
    pack_8x1_2t_pixels(src_ptr, signal);
    filter_8x1_2t_pixels(signal, &ff, &res0);
    store_8x1_pixels(&res0, &max, dst_ptr);
  }
}